

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O0

unsigned_long PaUtil_EndBufferProcessing(PaUtilBufferProcessor *bp,int *streamCallbackResult)

{
  long lVar1;
  unsigned_long uVar2;
  unsigned_long in_RSI;
  PaUtilChannelDescriptor *in_RDI;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  int *in_stack_00000008;
  PaUtilBufferProcessor *in_stack_00000010;
  unsigned_long framesProcessedThisIteration;
  PaUtilChannelDescriptor *hostOutputChannels;
  unsigned_long *hostOutputFrameCount;
  unsigned_long noOutputOutputFrameCount;
  PaUtilChannelDescriptor *hostInputChannels;
  unsigned_long *hostInputFrameCount;
  unsigned_long noInputInputFrameCount;
  unsigned_long framesProcessed;
  unsigned_long framesToGo;
  unsigned_long framesToProcess;
  void *local_78;
  PaUtilChannelDescriptor *local_50;
  unsigned_long in_stack_ffffffffffffffc8;
  PaUtilChannelDescriptor *pPVar3;
  PaUtilChannelDescriptor *in_stack_ffffffffffffffd0;
  int *streamCallbackResult_00;
  PaUtilBufferProcessor *in_stack_ffffffffffffffe0;
  
  streamCallbackResult_00 = (int *)0x0;
  if (*(int *)((long)&in_RDI[1].data + 4) == 0) {
    if ((in_RDI[2].stride == 0) || (in_RDI[4].stride == 0)) {
      if (in_RDI[2].stride == 0) {
        streamCallbackResult_00 =
             (int *)AdaptingOutputOnlyProcess
                              (in_stack_ffffffffffffffe0,(int *)0x0,in_stack_ffffffffffffffd0,
                               in_stack_ffffffffffffffc8);
        if (in_RDI[0xf].data != (void *)0x0) {
          uVar2 = AdaptingOutputOnlyProcess
                            (in_stack_ffffffffffffffe0,streamCallbackResult_00,
                             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
          streamCallbackResult_00 = (int *)(uVar2 + (long)streamCallbackResult_00);
        }
      }
      else {
        streamCallbackResult_00 =
             (int *)AdaptingInputOnlyProcess
                              (in_stack_ffffffffffffffe0,(int *)0x0,in_stack_ffffffffffffffd0,
                               in_stack_ffffffffffffffc8);
        if (*(long *)&in_RDI[0xc].stride != 0) {
          uVar2 = AdaptingInputOnlyProcess
                            (in_stack_ffffffffffffffe0,streamCallbackResult_00,
                             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
          streamCallbackResult_00 = (int *)(uVar2 + (long)streamCallbackResult_00);
        }
      }
    }
    else if (*(int *)&in_RDI[1].data == 3) {
      streamCallbackResult_00 =
           (int *)AdaptingProcess(in_stack_00000010,in_stack_00000008,unaff_retaddr_00);
    }
    else {
      streamCallbackResult_00 =
           (int *)AdaptingProcess(in_stack_00000010,in_stack_00000008,unaff_retaddr_00);
    }
  }
  else if ((in_RDI[2].stride == 0) || (in_RDI[4].stride == 0)) {
    streamCallbackResult_00 =
         (int *)NonAdaptingProcess(in_stack_00000010,in_stack_00000008,
                                   (PaUtilChannelDescriptor *)
                                   CONCAT44(unaff_retaddr_00,unaff_retaddr),in_RDI,in_RSI);
    if (in_RDI[2].stride == 0) {
      local_78 = in_RDI[0xf].data;
    }
    else {
      local_78 = *(void **)&in_RDI[0xc].stride;
    }
    if (local_78 != (void *)0x0) {
      uVar2 = NonAdaptingProcess(in_stack_00000010,in_stack_00000008,
                                 (PaUtilChannelDescriptor *)CONCAT44(unaff_retaddr_00,unaff_retaddr)
                                 ,in_RDI,in_RSI);
      streamCallbackResult_00 = (int *)(uVar2 + (long)streamCallbackResult_00);
    }
  }
  else {
    lVar1 = *(long *)&in_RDI[0xe].stride + (long)in_RDI[0xf].data;
    do {
      if (*in_RDI[0xd].data == 0) {
        pPVar3 = (PaUtilChannelDescriptor *)&stack0xffffffffffffffd0;
      }
      else if (in_RDI[0xc].data == (void *)0x0) {
        pPVar3 = (PaUtilChannelDescriptor *)&in_RDI[0xc].stride;
      }
      else {
        pPVar3 = in_RDI + 0xc;
      }
      if (*(long *)&in_RDI[0xe].stride == 0) {
        local_50 = in_RDI + 0xf;
      }
      else {
        local_50 = (PaUtilChannelDescriptor *)&in_RDI[0xe].stride;
      }
      uVar2 = NonAdaptingProcess(in_stack_00000010,in_stack_00000008,
                                 (PaUtilChannelDescriptor *)CONCAT44(unaff_retaddr_00,unaff_retaddr)
                                 ,in_RDI,in_RSI);
      pPVar3->data = (void *)((long)pPVar3->data - uVar2);
      local_50->data = (void *)((long)local_50->data - uVar2);
      streamCallbackResult_00 = (int *)(uVar2 + (long)streamCallbackResult_00);
      lVar1 = lVar1 - uVar2;
    } while (lVar1 != 0);
  }
  return (unsigned_long)streamCallbackResult_00;
}

Assistant:

unsigned long PaUtil_EndBufferProcessing( PaUtilBufferProcessor* bp, int *streamCallbackResult )
{
    unsigned long framesToProcess, framesToGo;
    unsigned long framesProcessed = 0;
    
    if( bp->inputChannelCount != 0 && bp->outputChannelCount != 0
            && bp->hostInputChannels[0][0].data /* input was supplied (see PaUtil_SetNoInput) */
            && bp->hostOutputChannels[0][0].data /* output was supplied (see PaUtil_SetNoOutput) */ )
    {
        assert( (bp->hostInputFrameCount[0] + bp->hostInputFrameCount[1]) ==
                (bp->hostOutputFrameCount[0] + bp->hostOutputFrameCount[1]) );
    }

    assert( *streamCallbackResult == paContinue
            || *streamCallbackResult == paComplete
            || *streamCallbackResult == paAbort ); /* don't forget to pass in a valid callback result value */

    if( bp->useNonAdaptingProcess )
    {
        if( bp->inputChannelCount != 0 && bp->outputChannelCount != 0 )
        {
            /* full duplex non-adapting process, splice buffers if they are
                different lengths */

            framesToGo = bp->hostOutputFrameCount[0] + bp->hostOutputFrameCount[1]; /* relies on assert above for input/output equivalence */

            do{
                unsigned long noInputInputFrameCount;
                unsigned long *hostInputFrameCount;
                PaUtilChannelDescriptor *hostInputChannels;
                unsigned long noOutputOutputFrameCount;
                unsigned long *hostOutputFrameCount;
                PaUtilChannelDescriptor *hostOutputChannels;
                unsigned long framesProcessedThisIteration;

                if( !bp->hostInputChannels[0][0].data )
                {
                    /* no input was supplied (see PaUtil_SetNoInput)
                        NonAdaptingProcess knows how to deal with this
                    */
                    noInputInputFrameCount = framesToGo;
                    hostInputFrameCount = &noInputInputFrameCount;
                    hostInputChannels = 0;
                }
                else if( bp->hostInputFrameCount[0] != 0 )
                {
                    hostInputFrameCount = &bp->hostInputFrameCount[0];
                    hostInputChannels = bp->hostInputChannels[0];
                }
                else
                {
                    hostInputFrameCount = &bp->hostInputFrameCount[1];
                    hostInputChannels = bp->hostInputChannels[1];
                }

                if( !bp->hostOutputChannels[0][0].data )
                {
                    /* no output was supplied (see PaUtil_SetNoOutput)
                        NonAdaptingProcess knows how to deal with this
                    */
                    noOutputOutputFrameCount = framesToGo;
                    hostOutputFrameCount = &noOutputOutputFrameCount;
                    hostOutputChannels = 0;
                }
                if( bp->hostOutputFrameCount[0] != 0 )
                {
                    hostOutputFrameCount = &bp->hostOutputFrameCount[0];
                    hostOutputChannels = bp->hostOutputChannels[0];
                }
                else
                {
                    hostOutputFrameCount = &bp->hostOutputFrameCount[1];
                    hostOutputChannels = bp->hostOutputChannels[1];
                }

                framesToProcess = PA_MIN_( *hostInputFrameCount,
                                       *hostOutputFrameCount );

                assert( framesToProcess != 0 );
                
                framesProcessedThisIteration = NonAdaptingProcess( bp, streamCallbackResult,
                        hostInputChannels, hostOutputChannels,
                        framesToProcess );                                       

                *hostInputFrameCount -= framesProcessedThisIteration;
                *hostOutputFrameCount -= framesProcessedThisIteration;

                framesProcessed += framesProcessedThisIteration;
                framesToGo -= framesProcessedThisIteration;
                
            }while( framesToGo > 0 );
        }
        else
        {
            /* half duplex non-adapting process, just process 1st and 2nd buffer */
            /* process first buffer */

            framesToProcess = (bp->inputChannelCount != 0)
                            ? bp->hostInputFrameCount[0]
                            : bp->hostOutputFrameCount[0];

            framesProcessed = NonAdaptingProcess( bp, streamCallbackResult,
                        bp->hostInputChannels[0], bp->hostOutputChannels[0],
                        framesToProcess );

            /* process second buffer if provided */
    
            framesToProcess = (bp->inputChannelCount != 0)
                            ? bp->hostInputFrameCount[1]
                            : bp->hostOutputFrameCount[1];
            if( framesToProcess > 0 )
            {
                framesProcessed += NonAdaptingProcess( bp, streamCallbackResult,
                    bp->hostInputChannels[1], bp->hostOutputChannels[1],
                    framesToProcess );
            }
        }
    }
    else /* block adaption necessary*/
    {

        if( bp->inputChannelCount != 0 && bp->outputChannelCount != 0 )
        {
            /* full duplex */
            
            if( bp->hostBufferSizeMode == paUtilVariableHostBufferSizePartialUsageAllowed  )
            {
                framesProcessed = AdaptingProcess( bp, streamCallbackResult,
                        0 /* dont process partial user buffers */ );
            }
            else
            {
                framesProcessed = AdaptingProcess( bp, streamCallbackResult,
                        1 /* process partial user buffers */ );
            }
        }
        else if( bp->inputChannelCount != 0 )
        {
            /* input only */
            framesToProcess = bp->hostInputFrameCount[0];

            framesProcessed = AdaptingInputOnlyProcess( bp, streamCallbackResult,
                        bp->hostInputChannels[0], framesToProcess );

            framesToProcess = bp->hostInputFrameCount[1];
            if( framesToProcess > 0 )
            {
                framesProcessed += AdaptingInputOnlyProcess( bp, streamCallbackResult,
                        bp->hostInputChannels[1], framesToProcess );
            }
        }
        else
        {
            /* output only */
            framesToProcess = bp->hostOutputFrameCount[0];

            framesProcessed = AdaptingOutputOnlyProcess( bp, streamCallbackResult,
                        bp->hostOutputChannels[0], framesToProcess );

            framesToProcess = bp->hostOutputFrameCount[1];
            if( framesToProcess > 0 )
            {
                framesProcessed += AdaptingOutputOnlyProcess( bp, streamCallbackResult,
                        bp->hostOutputChannels[1], framesToProcess );
            }
        }
    }

    return framesProcessed;
}